

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O0

double ipx::Infnorm(SparseMatrix *A)

{
  Int IVar1;
  char *pcVar2;
  double *pdVar3;
  int __c;
  int __x;
  SparseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  valarray<double> *this;
  Int p;
  Int j;
  Vector rowsum;
  undefined4 in_stack_ffffffffffffff88;
  Int in_stack_ffffffffffffff8c;
  SparseMatrix *in_stack_ffffffffffffff90;
  Vector *in_stack_ffffffffffffffb0;
  uint local_30;
  int local_1c;
  valarray<double> local_18;
  SparseMatrix *local_8;
  
  local_8 = in_RDI;
  SparseMatrix::rows(in_RDI);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_ffffffffffffff90,
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_1c = 0;
  while( true ) {
    IVar1 = SparseMatrix::cols((SparseMatrix *)0x84e63a);
    if (IVar1 <= local_1c) break;
    local_30 = SparseMatrix::begin(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    while( true ) {
      IVar1 = SparseMatrix::end(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if (IVar1 <= (int)local_30) break;
      __x = (int)local_8;
      in_stack_ffffffffffffffb0 =
           (Vector *)SparseMatrix::value(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      std::abs(__x);
      pcVar2 = SparseMatrix::index(local_8,(char *)(ulong)local_30,__c);
      pdVar3 = std::valarray<double>::operator[](&local_18,(long)(int)pcVar2);
      *pdVar3 = extraout_XMM0_Qa + *pdVar3;
      local_30 = local_30 + 1;
    }
    local_1c = local_1c + 1;
  }
  this = (valarray<double> *)Infnorm(in_stack_ffffffffffffffb0);
  std::valarray<double>::~valarray(this);
  return (double)this;
}

Assistant:

double Infnorm(const SparseMatrix& A) {
    Vector rowsum(A.rows());
    for (Int j = 0; j < A.cols(); j++) {
        for (Int p = A.begin(j); p < A.end(j); p++)
            rowsum[A.index(p)] += std::abs(A.value(p));
    }
    return Infnorm(rowsum);
}